

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O1

void ncnn::draw_text_c4(uchar *pixels,int w,int h,int stride,char *text,int x,int y,
                       int fontpixelsize,uint color)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uchar *resized_font_bitmap;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uchar *puVar10;
  ulong uVar11;
  uint uVar12;
  uchar *puVar13;
  long lVar14;
  
  resized_font_bitmap = (uchar *)operator_new__((ulong)(uint)(fontpixelsize * fontpixelsize * 2));
  sVar5 = strlen(text);
  if (0 < (int)(uint)sVar5) {
    uVar7 = 0;
    uVar4 = x;
    do {
      cVar1 = text[uVar7];
      if (cVar1 == ' ') {
        uVar9 = uVar4 + fontpixelsize;
      }
      else if (cVar1 == '\n') {
        y = y + fontpixelsize * 2;
        uVar9 = x;
      }
      else {
        iVar3 = isprint((int)cVar1);
        uVar9 = uVar4;
        if (iVar3 != 0) {
          resize_bilinear_font
                    ((uchar *)((long)cVar1 * 400 + 0x5f34c0),resized_font_bitmap,fontpixelsize);
          uVar8 = 0;
          if (0 < y) {
            uVar8 = y;
          }
          uVar12 = y + fontpixelsize * 2;
          if (h <= (int)uVar12) {
            uVar12 = h;
          }
          uVar6 = 0;
          if (0 < (int)uVar4) {
            uVar6 = (ulong)uVar4;
          }
          uVar9 = uVar4 + fontpixelsize;
          uVar2 = w;
          if ((int)uVar9 < w) {
            uVar2 = uVar9;
          }
          if ((int)uVar8 < (int)uVar12) {
            iVar3 = (int)uVar6;
            uVar11 = (ulong)uVar8;
            puVar10 = pixels + (long)stride * uVar11 + (ulong)(uint)(iVar3 * 4);
            puVar13 = resized_font_bitmap +
                      (((uVar11 - (long)y) * (long)fontpixelsize + uVar6) - (long)(int)uVar4);
            do {
              if (iVar3 < (int)uVar2) {
                lVar14 = 0;
                do {
                  uVar8 = (uint)puVar13[lVar14];
                  uVar4 = uVar8 ^ 0xff;
                  puVar10[lVar14 * 4] =
                       (uchar)((ulong)((color & 0xff) * (uint)puVar13[lVar14] +
                                      puVar10[lVar14 * 4] * uVar4) * 0x1010102 >> 0x20);
                  puVar10[lVar14 * 4 + 1] =
                       (uchar)((ulong)((color >> 8 & 0xff) * uVar8 + puVar10[lVar14 * 4 + 1] * uVar4
                                      ) * 0x1010102 >> 0x20);
                  puVar10[lVar14 * 4 + 2] =
                       (uchar)((ulong)((color >> 0x10 & 0xff) * uVar8 +
                                      puVar10[lVar14 * 4 + 2] * uVar4) * 0x1010102 >> 0x20);
                  puVar10[lVar14 * 4 + 3] =
                       (uchar)((ulong)(uVar8 * (color >> 0x18) + puVar10[lVar14 * 4 + 3] * uVar4) *
                               0x1010102 >> 0x20);
                  lVar14 = lVar14 + 1;
                } while (uVar2 - iVar3 != (int)lVar14);
              }
              uVar11 = uVar11 + 1;
              puVar10 = puVar10 + stride;
              puVar13 = puVar13 + fontpixelsize;
            } while (uVar11 != uVar12);
          }
        }
      }
      uVar4 = uVar9;
      uVar7 = uVar7 + 1;
    } while (uVar7 != ((uint)sVar5 & 0x7fffffff));
  }
  operator_delete__(resized_font_bitmap);
  return;
}

Assistant:

void draw_text_c4(unsigned char* pixels, int w, int h, int stride, const char* text, int x, int y, int fontpixelsize, unsigned int color)
{
    const unsigned char* pen_color = (const unsigned char*)&color;

    unsigned char* resized_font_bitmap = new unsigned char[fontpixelsize * fontpixelsize * 2];

    const int n = strlen(text);

    int cursor_x = x;
    int cursor_y = y;
    for (int i = 0; i < n; i++)
    {
        char ch = text[i];

        if (ch == '\n')
        {
            // newline
            cursor_x = x;
            cursor_y += fontpixelsize * 2;
            continue;
        }

        if (ch == ' ')
        {
            cursor_x += fontpixelsize;
            continue;
        }

        if (isprint(ch) != 0)
        {
            const unsigned char* font_bitmap = mono_font_data[ch - '!'];

            // draw resized character
            resize_bilinear_font(font_bitmap, resized_font_bitmap, fontpixelsize);

            const int ystart = std::max(cursor_y, 0);
            const int yend = std::min(cursor_y + fontpixelsize * 2, h);
            const int xstart = std::max(cursor_x, 0);
            const int xend = std::min(cursor_x + fontpixelsize, w);

            for (int j = ystart; j < yend; j++)
            {
                const unsigned char* palpha = resized_font_bitmap + (j - cursor_y) * fontpixelsize + xstart - cursor_x;
                unsigned char* p = pixels + stride * j + xstart * 4;

                for (int k = xstart; k < xend; k++)
                {
                    unsigned char alpha = *palpha++;

                    p[0] = (p[0] * (255 - alpha) + pen_color[0] * alpha) / 255;
                    p[1] = (p[1] * (255 - alpha) + pen_color[1] * alpha) / 255;
                    p[2] = (p[2] * (255 - alpha) + pen_color[2] * alpha) / 255;
                    p[3] = (p[3] * (255 - alpha) + pen_color[3] * alpha) / 255;
                    p += 4;
                }
            }

            cursor_x += fontpixelsize;
        }
    }

    delete[] resized_font_bitmap;
}